

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceL2LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducel2(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceL2LayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducel2(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducel2(this);
    this_00 = (ReduceL2LayerParams *)operator_new(0x30);
    ReduceL2LayerParams::ReduceL2LayerParams(this_00);
    (this->layer_).reducel2_ = this_00;
  }
  return (ReduceL2LayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceL2LayerParams* NeuralNetworkLayer::mutable_reducel2() {
  if (!has_reducel2()) {
    clear_layer();
    set_has_reducel2();
    layer_.reducel2_ = new ::CoreML::Specification::ReduceL2LayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceL2)
  return layer_.reducel2_;
}